

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O1

uint8_t read_varuint7(uint8_t **cursor,uint8_t *end)

{
  uint8_t uVar1;
  undefined8 extraout_RAX;
  string local_28;
  
  uVar1 = read_byte(cursor,end);
  if (-1 < (char)uVar1) {
    return uVar1;
  }
  StringFormat_abi_cxx11_(&local_28,"malformed %d",0x12a);
  ThrowString(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

uint8_t read_varuint7 (uint8_t** cursor, const uint8_t* end)
{
    const uint8_t result = read_byte (cursor, end);
    if (result & 0x80)
        ThrowString (StringFormat ("malformed %d", __LINE__)); // UNDONE context (move to module or section)
    return result;
}